

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlparser.h
# Opt level: O1

bool __thiscall httpparser::UrlParser::isUnreserved(UrlParser *this,char ch)

{
  bool bVar1;
  int iVar2;
  undefined3 in_register_00000031;
  
  iVar2 = isalnum(CONCAT31(in_register_00000031,ch));
  bVar1 = true;
  if ((((iVar2 == 0) && (iVar2 = (int)ch, 1 < iVar2 - 0x2dU)) && (iVar2 != 0x5f)) && (iVar2 != 0x7e)
     ) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool isUnreserved(char ch) const
    {
        if( isalnum(ch) )
            return true;

        switch(ch)
        {
        case '-':
        case '.':
        case '_':
        case '~':
            return true;
        }

        return false;
    }